

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generators.c
# Opt level: O0

void fib_gen(void *null)

{
  Value VVar1;
  _Bool _Var2;
  uint64_t tmp;
  Value v;
  uint64_t f1;
  uint64_t f0;
  void *null_local;
  
  f1 = 0;
  v.u64 = 1;
  tmp = 0;
  f0 = (uint64_t)null;
  gen_yield((Value *)&tmp);
  while( true ) {
    _Var2 = gen_should_finish();
    if (((_Var2 ^ 0xffU) & 1) == 0) break;
    tmp = v.u64;
    gen_yield((Value *)&tmp);
    VVar1 = v;
    v.u64 = f1 + v.u64;
    f1 = VVar1.u64;
  }
  return;
}

Assistant:

static void
fib_gen(void *null)
{
    (void) null;
    uint64_t f0 = 0;
    uint64_t f1 = 1;
    Value v;
    v.u64 = f0;
    gen_yield(&v);
    while (!gen_should_finish()) {
        v.u64 = f1;
        gen_yield(&v);
        uint64_t tmp = f0;
        f0 = f1;
        f1 += tmp;
    }
}